

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> __thiscall
enact::Parser::expectTypenamePrecPrimary(Parser *this,string *msg,bool emptyAllowed)

{
  int iVar1;
  long lVar2;
  VariableTypename *this_00;
  ParseError *__return_storage_ptr__;
  char in_CL;
  undefined7 in_register_00000011;
  _Head_base<0UL,_const_enact::Typename_*,_false> _Var3;
  size_type __dnew;
  Token paren;
  size_type __dnew_1;
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  elementTypenames;
  string local_b0;
  __uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_> local_90;
  undefined1 local_88 [16];
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined4 local_58;
  undefined2 local_54;
  pointer local_50;
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  local_48;
  
  iVar1 = *(int *)&msg[7]._M_dataplus._M_p;
  local_90._M_t.
  super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
  super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl =
       (tuple<const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>)
       (tuple<const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>)this;
  if (iVar1 == 0) {
    advance((Parser *)msg);
    local_88._8_4_ = *(undefined4 *)&msg[5].field_2;
    local_78 = local_70._M_local_buf + 8;
    lVar2 = *(long *)((long)&msg[5].field_2 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,lVar2,msg[6]._M_dataplus._M_p + lVar2);
    local_54 = *(undefined2 *)((long)&msg[6].field_2 + 0xc);
    local_58 = *(undefined4 *)((long)&msg[6].field_2 + 8);
    local_48.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (*(int *)&msg[7]._M_dataplus._M_p != 1) {
      while( true ) {
        local_50 = (pointer)0x1c;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        local_b0._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_b0,(ulong)&local_50);
        local_b0.field_2._M_allocated_capacity = (size_type)local_50;
        builtin_strncpy(local_b0._M_dataplus._M_p,"Expected typename after \'(\'.",0x1c);
        local_b0._M_string_length = (size_type)local_50;
        local_b0._M_dataplus._M_p[(long)local_50] = '\0';
        expectTypenamePrecFunction((Parser *)local_88,msg,SUB81(&local_b0,0));
        std::
        vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>
        ::
        emplace_back<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>
                  ((vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>
                    *)&local_48,
                   (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *
                   )local_88);
        if ((CompileContext *)local_88._0_8_ != (CompileContext *)0x0) {
          (**(code **)((((string *)local_88._0_8_)->_M_dataplus)._M_p + 8))();
        }
        local_88._0_8_ = (CompileContext *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (*(int *)&msg[7]._M_dataplus._M_p != 9) break;
        advance((Parser *)msg);
      }
    }
    local_50 = (pointer)0x25;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_b0,(ulong)&local_50);
    local_b0.field_2._M_allocated_capacity = (size_type)local_50;
    builtin_strncpy(local_b0._M_dataplus._M_p,"Expected \')\' after typename elements.",0x25);
    local_b0._M_string_length = (size_type)local_50;
    local_b0._M_dataplus._M_p[(long)local_50] = '\0';
    expect((Parser *)msg,RIGHT_PAREN,&local_b0);
    _Var3._M_head_impl = (Typename *)local_90;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((long)local_48.
              super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_48.
              super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 8) {
      *_Var3._M_head_impl =
           (Typename)
           ((local_48.
             super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
           .super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl;
      ((local_48.
        super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
      super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t
      .super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
      super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl = (Typename *)0x0;
    }
    else {
      std::
      make_unique<enact::TupleTypename,std::vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>,enact::Token>
                ((vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                  *)&local_b0,(Token *)&local_48);
      *_Var3._M_head_impl = (Typename)local_b0._M_dataplus._M_p;
    }
    std::
    vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ::~vector(&local_48);
    if (local_78 != local_70._M_local_buf + 8) {
      operator_delete(local_78,local_70._8_8_ + 1);
    }
  }
  else {
    if (iVar1 == 10) {
      advance((Parser *)msg);
      local_b0._M_dataplus._M_p = (pointer)0x26;
      local_88._8_8_ = &local_70;
      local_88._8_8_ = std::__cxx11::string::_M_create((ulong *)(local_88 + 8),(ulong)&local_b0);
      local_70._M_allocated_capacity = (size_type)local_b0._M_dataplus._M_p;
      *(char *)(local_88._8_8_ + 0x10) = 'r';
      *(char *)(local_88._8_8_ + 0x11) = 'i';
      *(char *)(local_88._8_8_ + 0x12) = 'a';
      *(char *)(local_88._8_8_ + 0x13) = 'b';
      *(char *)(local_88._8_8_ + 0x14) = 'l';
      *(char *)(local_88._8_8_ + 0x15) = 'e';
      *(char *)(local_88._8_8_ + 0x16) = ' ';
      *(char *)(local_88._8_8_ + 0x17) = 'n';
      *(char *)(local_88._8_8_ + 0x18) = 'a';
      *(char *)(local_88._8_8_ + 0x19) = 'm';
      *(char *)(local_88._8_8_ + 0x1a) = 'e';
      *(char *)(local_88._8_8_ + 0x1b) = ' ';
      *(char *)(local_88._8_8_ + 0x1c) = 'a';
      *(char *)(local_88._8_8_ + 0x1d) = 'f';
      *(char *)(local_88._8_8_ + 0x1e) = 't';
      *(char *)(local_88._8_8_ + 0x1f) = 'e';
      *(undefined8 *)local_88._8_8_ = 0x6465746365707845;
      *(char *)(local_88._8_8_ + 8) = ' ';
      *(char *)(local_88._8_8_ + 9) = 't';
      *(char *)(local_88._8_8_ + 10) = 'y';
      *(char *)(local_88._8_8_ + 0xb) = 'p';
      *(char *)(local_88._8_8_ + 0xc) = 'e';
      *(char *)(local_88._8_8_ + 0xd) = ' ';
      *(char *)(local_88._8_8_ + 0xe) = 'v';
      *(char *)(local_88._8_8_ + 0xf) = 'a';
      *(char *)(local_88._8_8_ + 0x1e) = 't';
      *(char *)(local_88._8_8_ + 0x1f) = 'e';
      *(char *)(local_88._8_8_ + 0x20) = 'r';
      *(char *)(local_88._8_8_ + 0x21) = ' ';
      *(char *)(local_88._8_8_ + 0x22) = '\'';
      *(char *)(local_88._8_8_ + 0x23) = '$';
      *(char *)(local_88._8_8_ + 0x24) = '\'';
      *(char *)(local_88._8_8_ + 0x25) = '.';
      local_78 = local_b0._M_dataplus._M_p;
      *(char *)(local_88._8_8_ + (long)local_b0._M_dataplus._M_p) = '\0';
      expect((Parser *)msg,IDENTIFIER,(string *)(local_88 + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._8_8_ != &local_70) {
        operator_delete((void *)local_88._8_8_,local_70._M_allocated_capacity + 1);
      }
      this_00 = (VariableTypename *)operator_new(0x58);
      local_88._8_4_ = *(undefined4 *)&msg[5].field_2;
      local_78 = local_70._M_local_buf + 8;
      lVar2 = *(long *)((long)&msg[5].field_2 + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,lVar2,msg[6]._M_dataplus._M_p + lVar2);
      local_54 = *(undefined2 *)((long)&msg[6].field_2 + 0xc);
      local_58 = *(undefined4 *)((long)&msg[6].field_2 + 8);
      VariableTypename::VariableTypename(this_00,(Token *)(local_88 + 8));
    }
    else {
      if (iVar1 != 0x22) {
        if (in_CL != '\0') {
          std::make_unique<enact::BasicTypename,char_const(&)[1],enact::Token&>
                    ((char (*) [1])this,(Token *)0x11c17d);
          return (__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
                  )(__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
                    )this;
        }
        __return_storage_ptr__ = (ParseError *)__cxa_allocate_exception(0x10);
        error(__return_storage_ptr__,(Parser *)msg,
              (string *)CONCAT71(in_register_00000011,emptyAllowed));
        __cxa_throw(__return_storage_ptr__,&ParseError::typeinfo,std::runtime_error::~runtime_error)
        ;
      }
      advance((Parser *)msg);
      this_00 = (VariableTypename *)operator_new(0x58);
      local_88._8_4_ = *(undefined4 *)&msg[5].field_2;
      local_78 = local_70._M_local_buf + 8;
      lVar2 = *(long *)((long)&msg[5].field_2 + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,lVar2,msg[6]._M_dataplus._M_p + lVar2);
      local_54 = *(undefined2 *)((long)&msg[6].field_2 + 0xc);
      local_58 = *(undefined4 *)((long)&msg[6].field_2 + 8);
      BasicTypename::BasicTypename((BasicTypename *)this_00,(Token *)(local_88 + 8));
    }
    _Var3._M_head_impl =
         (Typename *)
         local_90._M_t.
         super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
         .super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl;
    if (local_78 != local_70._M_local_buf + 8) {
      operator_delete(local_78,local_70._8_8_ + 1);
    }
    *_Var3._M_head_impl = (Typename)this_00;
  }
  return (__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
          )(tuple<const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>)
           _Var3._M_head_impl;
}

Assistant:

std::unique_ptr<const Typename> Parser::expectTypenamePrecPrimary(const std::string &msg, bool emptyAllowed) {
        if (consume(TokenType::IDENTIFIER)) {
            return std::make_unique<BasicTypename>(m_previous);
        }

        if (consume(TokenType::DOLLAR)) {
            expect(TokenType::IDENTIFIER, "Expected type variable name after '$'.");
            return std::make_unique<VariableTypename>(m_previous);
        }

        // Unit/grouped/tuple typename?
        if (consume(TokenType::LEFT_PAREN)) {
            Token paren = m_previous;

            std::vector<std::unique_ptr<const Typename>> elementTypenames;

            if (!check(TokenType::RIGHT_PAREN)) {
                do {
                    elementTypenames.push_back(expectTypename("Expected typename after '('."));
                } while (consume(TokenType::COMMA));
            }

            expect(TokenType::RIGHT_PAREN, "Expected ')' after typename elements.");

            // 1-tuples are equivalent to their contained type
            if (elementTypenames.size() == 1) {
                return std::move(elementTypenames[0]);
            } else {
                return std::make_unique<TupleTypename>(std::move(elementTypenames), std::move(paren));
            }
        }

        if (emptyAllowed) {
            return std::make_unique<BasicTypename>("", m_previous);
        }

        throw error(msg);
    }